

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

int kratos::fs::remove(char *__filename)

{
  int iVar1;
  
  iVar1 = ::remove(*(char **)__filename);
  return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 != 0);
}

Assistant:

bool remove(const std::string &filename) {
#if defined(INCLUDE_FILESYSTEM)
    namespace fs = std::filesystem;
    return fs::remove(filename);
#else
    return std::remove(filename.c_str());
#endif
}